

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_0::Visitor<long>::AppendVariableDeclarationBegin(Visitor<long> *this)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  basic_ostream<char,_std::char_traits<char>_> *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  Visitor<long> *in_stack_ffffffffffffffe0;
  
  poVar2 = Append(in_stack_ffffffffffffffe0);
  TypeName<long>();
  __str._M_str = (char *)in_stack_ffffffffffffffe0;
  __str._M_len = in_stack_ffffffffffffffd8;
  pbVar3 = std::operator<<(in_RDI,__str);
  std::operator<<(pbVar3," ");
  iVar1 = *(int *)(in_RDI + 0x24);
  *(int *)(in_RDI + 0x24) = iVar1 + 1;
  VariableName::VariableName((VariableName *)&stack0xffffffffffffffe4,iVar1 + 1);
  poVar2 = anon_unknown_0::operator<<(poVar2,(VariableName)(int)((ulong)in_RDI >> 0x20));
  std::operator<<(poVar2," = ");
  return;
}

Assistant:

void AppendVariableDeclarationBegin()
    {
        Append() << TypeName<TNumber>() << " " << VariableName(++lastVariableNo) << " = ";
    }